

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_exttime(char *p,rar *rar,char *endp)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  tm *__tp;
  uint uVar5;
  time_t *ptVar6;
  int *piVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  time_t t;
  tm tmbuf;
  time_t local_c0;
  uint local_b4;
  time_t *local_b0;
  long *local_a8;
  time_t *local_a0;
  long *local_98;
  time_t *local_90;
  long *local_88;
  time_t *local_80;
  long *local_78;
  int *local_70;
  tm local_68;
  
  piVar7 = (int *)(p + 2);
  iVar12 = -1;
  if (piVar7 <= endp) {
    uVar2 = *(ushort *)p;
    local_b0 = &rar->mtime;
    local_90 = &rar->atime;
    local_98 = &rar->ansec;
    local_80 = &rar->ctime;
    local_88 = &rar->cnsec;
    local_a0 = &rar->arctime;
    local_a8 = &rar->arcnsec;
    local_78 = &rar->mnsec;
    local_b4 = (uint)(uVar2 >> 0xc);
    iVar12 = 3;
    local_70 = (int *)endp;
    do {
      local_c0 = 0;
      if (iVar12 == 3) {
        local_c0 = *local_b0;
        if ((short)uVar2 < 0) {
          uVar10 = local_b4;
          if (local_c0 == 0) goto LAB_0062a361;
LAB_0062a37a:
          uVar5 = uVar10 & 3;
          piVar1 = (int *)((long)piVar7 + (ulong)uVar5);
          if (endp < piVar1) {
            return -1;
          }
          if ((ulong)uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            lVar8 = 0;
            uVar11 = 0;
            do {
              uVar11 = uVar11 >> 8 | (uint)*(byte *)((long)piVar7 + lVar8) << 0x10;
              lVar8 = lVar8 + 1;
            } while (uVar5 != (uint)lVar8);
            uVar5 = (uint)(9999999 < uVar11);
            piVar7 = piVar1;
          }
          __tp = localtime_r(&local_c0,&local_68);
          iVar3 = __tp->tm_sec;
          if ((uVar10 & 4) != 0) {
            __tp->tm_sec = iVar3 + 1;
            local_c0 = mktime(__tp);
          }
          ptVar6 = local_b0;
          plVar9 = local_78;
          if (((iVar12 != 3) && (ptVar6 = local_80, plVar9 = local_88, iVar12 != 2)) &&
             (ptVar6 = local_90, plVar9 = local_98, iVar12 != 1)) {
            ptVar6 = local_a0;
            plVar9 = local_a8;
          }
          *ptVar6 = local_c0;
          *plVar9 = (ulong)(iVar3 + uVar5);
          endp = (char *)local_70;
        }
      }
      else {
        uVar4 = uVar2 >> ((char)iVar12 * '\x04' & 0x1fU);
        uVar10 = (uint)uVar4;
        if ((uVar4 & 8) != 0) {
LAB_0062a361:
          if (endp < piVar7 + 1) {
            return -1;
          }
          local_c0 = get_time(*piVar7);
          piVar7 = piVar7 + 1;
          goto LAB_0062a37a;
        }
      }
      bVar13 = iVar12 != 0;
      iVar12 = iVar12 + -1;
    } while (bVar13);
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
  struct tm tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
  errno_t terr;
  __time64_t tmptime;
#endif

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = (((unsigned)(unsigned char)*p) << 16) | (rem >> 8);
        p++;
      }
#if defined(HAVE_LOCALTIME_R)
      tm = localtime_r(&t, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
      tmptime = t;
      terr = _localtime64_s(&tmbuf, &tmptime);
      if (terr)
        tm = NULL;
      else
        tm = &tmbuf;
#else
      tm = localtime(&t);
#endif
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}